

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O0

void copy_suite::remove_copy(void)

{
  initializer_list<int> __l;
  initializer_list<int> input;
  iterator second_begin;
  iterator second_end;
  iterator first_begin;
  iterator first_end;
  allocator<int> local_105;
  int local_104 [3];
  iterator local_f8;
  size_type local_f0;
  undefined1 local_e8 [8];
  vector<int,_std::allocator<int>_> expect;
  int local_c4;
  circular_view<int,_18446744073709551615UL> *local_c0;
  basic_iterator<int> local_b8;
  iterator local_a8;
  undefined1 local_98 [8];
  circular_view<int,_18446744073709551615UL> copy;
  int copy_array [4];
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  copy_array[2] = 0xb;
  copy_array[3] = 0x16;
  input._M_len = 5;
  input._M_array = copy_array + 2;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_98,
             (value_type (*) [4])&copy.member.next);
  local_a8 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_b8 = vista::circular_view<int,_18446744073709551615UL>::end
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_c0 = (circular_view<int,_18446744073709551615UL> *)
             std::back_inserter<vista::circular_view<int,18446744073709551615ul>>
                       ((circular_view<int,_18446744073709551615UL> *)local_98);
  local_c4 = 0x21;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                remove_copy<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>,int>
                          (local_a8,local_b8,
                           (back_insert_iterator<vista::circular_view<int,_18446744073709551615UL>_>
                           )local_c0,&local_c4);
  local_104[0] = 0x16;
  local_104[1] = 0x2c;
  local_104[2] = 0x37;
  local_f8 = local_104;
  local_f0 = 3;
  std::allocator<int>::allocator(&local_105);
  __l._M_len = local_f0;
  __l._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_e8,__l,&local_105);
  std::allocator<int>::~allocator(&local_105);
  first_begin = vista::circular_view<int,_18446744073709551615UL>::begin
                          ((circular_view<int,_18446744073709551615UL> *)local_98);
  first_end = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_98);
  second_begin = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_e8);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_e8);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x9c,"void copy_suite::remove_copy()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e8);
  return;
}

Assistant:

void remove_copy()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55 };
    int copy_array[4];
    circular_view<int> copy(copy_array);
    std::remove_copy(span.begin(), span.end(), std::back_inserter(copy), 33);
    {
        std::vector<int> expect = { 22, 44, 55 };
        BOOST_TEST_ALL_EQ(copy.begin(), copy.end(),
                          expect.begin(), expect.end());
    }
}